

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfNoLock(MapFieldBase *this)

{
  long in_RDI;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_8 = 0;
  }
  else {
    local_8 = RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
                        ((RepeatedPtrField<google::protobuf::Message> *)0x430386);
  }
  return local_8;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfNoLock() const {
  if (repeated_field_ != NULL) {
    return repeated_field_->SpaceUsedExcludingSelfLong();
  } else {
    return 0;
  }
}